

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

DWORD PROCGetProcessIDFromHandle(HANDLE hProcess)

{
  DWORD *local_40;
  CProcProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  CPalThread *pCStack_28;
  DWORD dwProcessId;
  CPalThread *pThread;
  IPalObject *pobjProcess;
  undefined1 *puStack_10;
  PAL_ERROR palError;
  HANDLE hProcess_local;
  
  pThread = (CPalThread *)0x0;
  puStack_10 = (undefined1 *)hProcess;
  pCStack_28 = CorUnix::InternalGetCurrentThread();
  pDataLock._4_4_ = 0;
  if (puStack_10 == &DAT_ffffff01) {
    pDataLock._4_4_ = gPID;
  }
  else {
    pobjProcess._4_4_ =
         (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                   (CorUnix::g_pObjectManager,pCStack_28,puStack_10,&aotProcess,0,&pThread);
    if (pobjProcess._4_4_ == 0) {
      pobjProcess._4_4_ =
           (*pThread->_vptr_CPalThread[3])(pThread,pCStack_28,0,&pLocalData,&local_40);
      if (pobjProcess._4_4_ == 0) {
        pDataLock._4_4_ = *local_40;
        (*(code *)**(undefined8 **)pLocalData)(pLocalData,pCStack_28,0);
      }
      (*pThread->_vptr_CPalThread[8])(pThread,pCStack_28);
    }
  }
  return pDataLock._4_4_;
}

Assistant:

DWORD
PROCGetProcessIDFromHandle(
        HANDLE hProcess)
{
    PAL_ERROR palError;
    IPalObject *pobjProcess = NULL;
    CPalThread *pThread = InternalGetCurrentThread();

    DWORD dwProcessId = 0;

    if (hPseudoCurrentProcess == hProcess)
    {
        dwProcessId = gPID;
        goto PROCGetProcessIDFromHandleExit;
    }


    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hProcess,
        &aotProcess,
        0,
        &pobjProcess
        );

    if (NO_ERROR == palError)
    {
        IDataLock *pDataLock;
        CProcProcessLocalData *pLocalData;

        palError = pobjProcess->GetProcessLocalData(
            pThread,
            ReadLock,
            &pDataLock,
            reinterpret_cast<void **>(&pLocalData)
            );

        if (NO_ERROR == palError)
        {
            dwProcessId = pLocalData->dwProcessId;
            pDataLock->ReleaseLock(pThread, FALSE);
        }

        pobjProcess->ReleaseReference(pThread);
    }

PROCGetProcessIDFromHandleExit:

    return dwProcessId;
}